

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void do_cmd_knowledge_shapechange(char *name,wchar_t row)

{
  bitflag *flags;
  size_t len;
  short sVar1;
  uint uVar2;
  long lVar3;
  class_book *pcVar4;
  class_spell *pcVar5;
  bool bVar6;
  _Bool _Var7;
  wchar_t wVar8;
  int iVar9;
  wchar_t wVar10;
  menu_iter *iter;
  textblock *tb;
  obj_property *poVar11;
  char **ppcVar12;
  textblock *tba;
  object_kind *poVar13;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  int *piVar19;
  long lVar20;
  player_ability *ppVar21;
  effect *peVar22;
  player_class *ppVar23;
  player_shape *ppVar24;
  int iVar25;
  wchar_t n;
  menu *m;
  long lVar26;
  void *p;
  bool bVar27;
  ui_event uVar28;
  wchar_t wnew;
  wchar_t hnew;
  region_conflict list_region;
  region_conflict header_region;
  char toa_msg [24];
  char tod_msg [24];
  char toh_msg [24];
  wchar_t local_344;
  wchar_t local_33c;
  ui_event local_338;
  ui_event local_328;
  void *local_318;
  ulong local_310;
  wchar_t local_304;
  wchar_t local_300;
  uint local_2fc;
  menu *local_2f8;
  void *local_2f0;
  long local_2e8;
  class_book *local_2e0;
  char ***local_2d8 [4];
  region local_2b8;
  region_conflict local_2a8;
  char **local_298 [26];
  char **local_1c8 [26];
  char **local_f8 [25];
  
  local_2a8.col = L'\0';
  local_2a8.row = L'\0';
  local_2a8.width = L'\xffffffff';
  local_2a8.page_rows = L'\x05';
  local_2b8.col = 0;
  local_2b8.row = 6;
  local_2b8.width = -1;
  local_2b8.page_rows = -2;
  wVar8 = count_interesting_shapes();
  if (wVar8 != L'\0') {
    iter = menu_find_iter(MN_ITER_STRINGS);
    local_2f8 = menu_new(MN_SKIN_SCROLL,iter);
    len = (long)wVar8 * 8;
    local_318 = mem_alloc(len);
    if (shapes != (player_shape *)0x0) {
      iVar25 = 0;
      ppVar24 = shapes;
      do {
        iVar9 = strcmp(ppVar24->name,"normal");
        if (iVar9 != 0) {
          *(player_shape **)((long)local_318 + (long)iVar25 * 8) = ppVar24;
          iVar25 = iVar25 + 1;
        }
        ppVar24 = ppVar24->next;
      } while (ppVar24 != (player_shape *)0x0);
    }
    p = local_318;
    sort(local_318,(long)wVar8,8,compare_shape_names);
    local_2f0 = mem_alloc(len);
    m = local_2f8;
    if (L'\0' < wVar8) {
      uVar14 = 0;
      do {
        *(undefined8 *)((long)local_2f0 + uVar14 * 8) =
             *(undefined8 *)(*(long *)((long)p + uVar14 * 8) + 8);
        uVar14 = uVar14 + 1;
      } while ((uint)wVar8 != uVar14);
    }
    menu_setpriv(local_2f8,wVar8,local_2f0);
    menu_layout(m,&local_2b8);
    *(byte *)&m->flags = (byte)m->flags | 0x10;
    screen_save();
    clear_from(L'\0');
    bVar6 = true;
    local_344 = L'\xffffffff';
    local_310 = 0;
    wVar17 = L'\0';
    bVar16 = true;
    local_304 = wVar8;
    do {
      uVar14 = local_310;
      local_328._8_4_ = 0;
      local_328.type = EVT_NONE;
      local_328.mouse.x = '\0';
      local_328.mouse.y = '\0';
      local_328.mouse.button = '\0';
      local_328.mouse.mods = '\0';
      Term_get_size(&local_33c,(int *)&local_2fc);
      local_310 = (ulong)local_2fc;
      if ((uint)uVar14 != local_2fc) {
        bVar16 = true;
      }
      if (bVar16) {
        region_erase(&local_2a8);
        prt("Knowledge - shapes",L'\x02',L'\0');
        prt("Name",L'\x04',L'\0');
        if (L'\0' < local_33c) {
          wVar18 = L'\0';
          do {
            Term_putch(wVar18,L'\x05',L'\x01',L'=');
            wVar18 = wVar18 + L'\x01';
            wVar10 = local_33c;
            if (L'O' < local_33c) {
              wVar10 = L'P';
            }
          } while (wVar18 < wVar10);
        }
        bVar16 = false;
        prt("<dir>, \'r\' to recall, ESC",(int)local_310 + L'\xfffffffe',L'\0');
      }
      if (local_344 != wVar17) {
        m->cursor = wVar17;
        local_344 = wVar17;
      }
      menu_refresh(m,false);
      handle_stuff(player);
      uVar28 = inkey_ex();
      local_338.mouse = uVar28.mouse;
      local_338.key.mods = uVar28.key.mods;
      if (uVar28.type == EVT_KBRD) {
        menu_handle_keypress(m,&local_338,&local_328);
      }
      else if (uVar28.type == EVT_MOUSE) {
        menu_handle_mouse(m,&local_338,&local_328);
      }
      if (local_328.type != EVT_NONE) {
        local_338._8_4_ = local_328._8_4_;
        local_338.mouse = local_328.mouse;
      }
      bVar27 = false;
      if ((int)local_338._0_4_ < 0x20) {
        if (local_338.type == EVT_KBRD) {
          bVar27 = (local_338.key.code & 0xffffffdf) == 0x52;
        }
        else {
          bVar27 = false;
          if (local_338.type == EVT_ESCAPE) {
            bVar27 = false;
            bVar6 = false;
          }
        }
      }
      else if (local_338.type == EVT_MOVE) {
        wVar17 = m->cursor;
        bVar27 = false;
      }
      else if (local_338.type == EVT_SELECT) {
        bVar27 = wVar17 == m->cursor;
      }
      if (bVar27) {
        if ((wVar17 < L'\0') || (wVar8 <= wVar17)) {
          __assert_fail("mark >= 0 && mark < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                        ,0xc6e,"void do_cmd_knowledge_shapechange(const char *, int)");
        }
        lVar3 = *(long *)((long)p + (ulong)(uint)wVar17 * 8);
        local_300 = wVar17;
        tb = textblock_new();
        textblock_append(tb,"%s",*(undefined8 *)(lVar3 + 8));
        textblock_append(tb,
                         "\nLike all shapes, the equipment at the time of the shapechange sets the base attributes, including damage per blow, number of blows and resistances.  While changed, items in your pack or on the floor (except for pickup or eating) are inaccessible.  To switch back to your normal shape, cast a spell or use an item command other than eat (drop, for instance).\n"
                        );
        bVar27 = *(int *)(lVar3 + 0x14) != 0;
        if (bVar27) {
          strnfmt((char *)local_298,0x18,"%+d to AC");
          local_2d8[0] = local_298;
        }
        uVar14 = (ulong)bVar27;
        if (*(int *)(lVar3 + 0x18) != 0) {
          strnfmt((char *)local_f8,0x18,"%+d to hit");
          local_2d8[uVar14] = local_f8;
          uVar14 = (ulong)(bVar27 + 1);
        }
        wVar8 = (wchar_t)uVar14;
        if (*(int *)(lVar3 + 0x1c) != 0) {
          strnfmt((char *)local_1c8,0x18,"%+d to damage");
          local_2d8[uVar14] = local_1c8;
          wVar8 = wVar8 + L'\x01';
        }
        if (wVar8 != L'\0') {
          textblock_append(tb,"Adds");
          shape_lore_append_list(tb,(char **)local_2d8,wVar8);
          textblock_append(tb,".\n");
        }
        local_298[0] = (char **)0x0;
        local_f8[0]._0_4_ = 0;
        local_1c8[0]._0_4_ = L'\0';
        piVar19 = &DAT_0027d1d8;
        uVar14 = 0;
        do {
          uVar2 = *(uint *)(lVar3 + 0x20 + uVar14 * 4);
          if (uVar2 != 0) {
            pcVar15 = "unknown skill";
            if (uVar14 < 10) {
              pcVar15 = (char *)((long)&DAT_0027d1d8 + (long)*piVar19);
            }
            pcVar15 = format("%+d to %s",(ulong)uVar2,pcVar15);
            shape_lore_helper_append_to_list(pcVar15,local_298,(int *)local_f8,(int *)local_1c8);
          }
          wVar8 = (wchar_t)local_1c8[0];
          uVar14 = uVar14 + 1;
          piVar19 = piVar19 + 1;
        } while (uVar14 != 10);
        lVar26 = (long)(wchar_t)local_1c8[0];
        if (0 < lVar26) {
          textblock_append(tb,"Adds");
          ppcVar12 = local_298[0];
          shape_lore_append_list(tb,local_298[0],wVar8);
          textblock_append(tb,".\n");
          lVar20 = 0;
          do {
            string_free(ppcVar12[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar26 != lVar20);
        }
        mem_free(local_298[0]);
        local_298[0] = (char **)0x0;
        local_f8[0]._0_4_ = 0;
        local_1c8[0]._0_4_ = L'\0';
        lVar26 = 0;
        do {
          uVar2 = *(uint *)(lVar3 + 100 + lVar26 * 4);
          if (uVar2 != 0) {
            poVar11 = lookup_obj_property(2,(int)lVar26 + 5);
            pcVar15 = format("%+d to %s",(ulong)uVar2,poVar11->name);
            shape_lore_helper_append_to_list(pcVar15,local_298,(int *)local_f8,(int *)local_1c8);
          }
          wVar8 = (wchar_t)local_1c8[0];
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0xb);
        lVar26 = (long)(wchar_t)local_1c8[0];
        if (0 < lVar26) {
          textblock_append(tb,"Adds");
          ppcVar12 = local_298[0];
          shape_lore_append_list(tb,local_298[0],wVar8);
          textblock_append(tb,".\n");
          lVar20 = 0;
          do {
            string_free(ppcVar12[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar26 != lVar20);
        }
        mem_free(local_298[0]);
        local_298[0] = (char **)0x0;
        local_f8[0]._0_4_ = 0;
        local_1c8[0]._0_4_ = L'\0';
        lVar26 = 0;
        do {
          uVar2 = *(uint *)(lVar3 + 0x50 + lVar26 * 4);
          if (uVar2 != 0) {
            poVar11 = lookup_obj_property(2,(int)lVar26);
            pcVar15 = format("%+d to %s",(ulong)uVar2,poVar11->name);
            shape_lore_helper_append_to_list(pcVar15,local_298,(int *)local_f8,(int *)local_1c8);
          }
          wVar8 = (wchar_t)local_1c8[0];
          lVar26 = lVar26 + 1;
        } while (lVar26 != 5);
        lVar26 = (long)(wchar_t)local_1c8[0];
        if (0 < lVar26) {
          textblock_append(tb,"Adds");
          ppcVar12 = local_298[0];
          shape_lore_append_list(tb,local_298[0],wVar8);
          textblock_append(tb,".\n");
          lVar20 = 0;
          do {
            string_free(ppcVar12[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar26 != lVar20);
        }
        mem_free(local_298[0]);
        ppcVar12 = &projections->name;
        lVar26 = 0;
        wVar18 = L'\0';
        wVar17 = L'\0';
        wVar8 = L'\0';
        do {
          sVar1 = *(short *)(lVar3 + 0x90 + lVar26 * 4);
          if (sVar1 < 0) {
            local_298[wVar8] = (char **)*ppcVar12;
            wVar8 = wVar8 + L'\x01';
          }
          else if (sVar1 < 3) {
            if (sVar1 != 0) {
              local_f8[wVar17] = (char **)*ppcVar12;
              wVar17 = wVar17 + L'\x01';
            }
          }
          else {
            local_1c8[wVar18] = (char **)*ppcVar12;
            wVar18 = wVar18 + L'\x01';
          }
          lVar26 = lVar26 + 1;
          ppcVar12 = ppcVar12 + 0xd;
        } while (lVar26 != 0x19);
        if (wVar8 != L'\0') {
          textblock_append(tb,"Makes you vulnerable to");
          shape_lore_append_list(tb,(char **)local_298,wVar8);
          textblock_append(tb,".\n");
        }
        if (wVar17 != L'\0') {
          textblock_append(tb,"Makes you resistant to");
          shape_lore_append_list(tb,(char **)local_f8,wVar17);
          textblock_append(tb,".\n");
        }
        if (wVar18 != L'\0') {
          textblock_append(tb,"Makes you immune to");
          shape_lore_append_list(tb,(char **)local_1c8,wVar18);
          textblock_append(tb,".\n");
        }
        local_298[0] = (char **)0x0;
        local_f8[0]._0_4_ = 0;
        local_1c8[0]._0_4_ = L'\0';
        flags = (bitflag *)(lVar3 + 0x48);
        iVar25 = 1;
        do {
          poVar11 = lookup_obj_property(3,iVar25);
          if ((poVar11->subtype == L'\x02') &&
             (_Var7 = flag_has_dbg(flags,5,poVar11->index,"s->flags","prop->index"), _Var7)) {
            shape_lore_helper_append_to_list
                      (poVar11->desc,local_298,(int *)local_f8,(int *)local_1c8);
          }
          wVar8 = (wchar_t)local_1c8[0];
          iVar25 = iVar25 + 1;
        } while (iVar25 != 0x27);
        lVar26 = (long)(wchar_t)local_1c8[0];
        if (0 < lVar26) {
          textblock_append(tb,"Provides protection from");
          ppcVar12 = local_298[0];
          shape_lore_append_list(tb,local_298[0],wVar8);
          textblock_append(tb,".\n");
          lVar20 = 0;
          do {
            string_free(ppcVar12[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar26 != lVar20);
        }
        mem_free(local_298[0]);
        local_298[0] = (char **)0x0;
        iVar25 = 0;
        local_f8[0]._0_4_ = 0;
        local_1c8[0]._0_4_ = L'\0';
        do {
          poVar11 = lookup_obj_property(1,iVar25);
          iVar9 = sustain_flag(poVar11->index);
          _Var7 = flag_has_dbg(flags,5,iVar9,"s->flags","sustain_flag(prop->index)");
          if (_Var7) {
            shape_lore_helper_append_to_list
                      (poVar11->name,local_298,(int *)local_f8,(int *)local_1c8);
          }
          wVar8 = (wchar_t)local_1c8[0];
          iVar25 = iVar25 + 1;
        } while (iVar25 != 5);
        lVar26 = (long)(wchar_t)local_1c8[0];
        if (0 < lVar26) {
          textblock_append(tb,"Sustains");
          ppcVar12 = local_298[0];
          shape_lore_append_list(tb,local_298[0],wVar8);
          textblock_append(tb,".\n");
          lVar20 = 0;
          do {
            string_free(ppcVar12[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar26 != lVar20);
        }
        mem_free(local_298[0]);
        iVar25 = 1;
        iVar9 = 0;
        do {
          poVar11 = lookup_obj_property(3,iVar25);
          if ((((uint)poVar11->subtype < 7) && ((0x68U >> (poVar11->subtype & 0x1fU) & 1) != 0)) &&
             (_Var7 = flag_has_dbg(flags,5,poVar11->index,"s->flags","prop->index"), _Var7)) {
            pcVar15 = "";
            if (0 < iVar9) {
              pcVar15 = "  ";
            }
            textblock_append(tb,"%s%s.",pcVar15);
            iVar9 = iVar9 + 1;
          }
          iVar25 = iVar25 + 1;
        } while (iVar25 != 0x27);
        if (player_abilities != (player_ability *)0x0) {
          ppVar21 = player_abilities;
          do {
            iVar25 = strcmp(ppVar21->type,"player");
            if ((iVar25 == 0) &&
               (_Var7 = flag_has_dbg((bitflag *)(lVar3 + 0x4d),3,(uint)ppVar21->index,"s->pflags",
                                     "ability->index"), _Var7)) {
              pcVar15 = "";
              if (0 < iVar9) {
                pcVar15 = "  ";
              }
              textblock_append(tb,"%s%s",pcVar15);
              iVar9 = iVar9 + 1;
            }
            ppVar21 = ppVar21->next;
          } while (ppVar21 != (player_ability *)0x0);
        }
        if (0 < iVar9) {
          textblock_append(tb,"\n");
        }
        tba = effect_describe(*(effect **)(lVar3 + 0xf8),"Changing into the shape ",0,false);
        if (tba != (textblock *)0x0) {
          textblock_append_textblock(tb,tba);
          textblock_free(tba);
          textblock_append(tb,".\n");
        }
        if (classes != (player_class *)0x0) {
          iVar25 = 0;
          ppVar23 = classes;
          do {
            if (L'\0' < (ppVar23->magic).num_books) {
              lVar26 = 0;
              do {
                pcVar4 = (ppVar23->magic).books;
                poVar13 = lookup_kind(pcVar4[lVar26].tval,pcVar4[lVar26].sval);
                local_2e8 = lVar26;
                if (((poVar13 != (object_kind *)0x0) && (poVar13->name != (char *)0x0)) &&
                   (L'\0' < pcVar4[lVar26].num_spells)) {
                  lVar20 = 0;
                  local_2e0 = pcVar4 + lVar26;
                  do {
                    pcVar5 = local_2e0->spells;
                    peVar22 = pcVar5[lVar20].effect;
                    if (peVar22 != (effect *)0x0) {
                      do {
                        if ((peVar22->index == 0x62) &&
                           (peVar22->subtype == *(wchar_t *)(lVar3 + 0x10))) {
                          if (iVar25 == 0) {
                            textblock_append(tb,"\n");
                          }
                          textblock_append(tb,"The %s spell, %s, from %s triggers the shapechange.",
                                           ppVar23->name,pcVar5[lVar20].name,poVar13->name);
                          iVar25 = iVar25 + 1;
                        }
                        peVar22 = peVar22->next;
                      } while (peVar22 != (effect *)0x0);
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < local_2e0->num_spells);
                }
                lVar26 = local_2e8 + 1;
              } while (lVar26 < (ppVar23->magic).num_books);
            }
            ppVar23 = ppVar23->next;
          } while (ppVar23 != (player_class *)0x0);
          if (0 < iVar25) {
            textblock_append(tb,"\n");
          }
        }
        textui_textblock_show(tb,(region_conflict)ZEXT816(0),(char *)0x0);
        textblock_free(tb);
        m = local_2f8;
        p = local_318;
        wVar8 = local_304;
        wVar17 = local_300;
      }
    } while (bVar6);
    screen_load();
    mem_free(local_2f0);
    mem_free(p);
    menu_free(m);
  }
  return;
}

Assistant:

static void do_cmd_knowledge_shapechange(const char *name, int row)
{
	region header_region = { 0, 0, -1, 5 };
	region list_region = { 0, 6, -1, -2 };
	int count = count_interesting_shapes();
	struct menu* m;
	struct player_shape **sarray;
	const char **narray;
	int h, mark, mark_old;
	bool displaying, redraw;
	struct player_shape *s;
	int i;

	if (!count) {
		return;
	}

	m = menu_new(MN_SKIN_SCROLL, menu_find_iter(MN_ITER_STRINGS));

	/* Set up an easily indexable list of the interesting shapes. */
	sarray = mem_alloc(count * sizeof(*sarray));
	for (s = shapes, i = 0; s; s = s->next) {
		if (streq(s->name, "normal")) {
			continue;
		}
		sarray[i] = s;
		++i;
	}

	/*
	 * Sort them alphabetically by name and set up an array with just the
	 * names.
	 */
	sort(sarray, count, sizeof(sarray[0]), compare_shape_names);
	narray = mem_alloc(count * sizeof(*narray));
	for (i = 0; i < count; ++i) {
		narray[i] = sarray[i]->name;
	}

	menu_setpriv(m, count, narray);
	menu_layout(m, &list_region);
	m->flags |= MN_DBL_TAP;

	screen_save();
	clear_from(0);

	h = 0;
	mark = 0;
	mark_old = -1;
	displaying = true;
	redraw = true;
	while (displaying) {
		bool recall = false;
		int wnew, hnew;
		ui_event ke0 = EVENT_EMPTY;
		ui_event ke;

		Term_get_size(&wnew, &hnew);
		if (h != hnew) {
			h = hnew;
			redraw = true;
		}

		if (redraw) {
			region_erase(&header_region);
			prt("Knowledge - shapes", 2, 0);
			prt("Name", 4, 0);
			for (i = 0; i < MIN(80, wnew); i++) {
				Term_putch(i, 5, COLOUR_WHITE, L'=');
			}
			prt("<dir>, 'r' to recall, ESC", h - 2, 0);
			redraw = false;
		}

		if (mark_old != mark) {
			mark_old = mark;
			m->cursor = mark;
		}

		menu_refresh(m, false);

		handle_stuff(player);

		ke = inkey_ex();
		if (ke.type == EVT_MOUSE) {
			menu_handle_mouse(m, &ke, &ke0);
		} else if (ke.type == EVT_KBRD) {
			menu_handle_keypress(m, &ke, &ke0);
		}
		if (ke0.type != EVT_NONE) {
			ke = ke0;
		}

		switch (ke.type) {
			case EVT_KBRD:
				if (ke.key.code == 'r' || ke.key.code == 'R') {
					recall = true;
				}
				break;

			case EVT_ESCAPE:
				displaying = false;
				break;

			case EVT_SELECT:
				if (mark == m->cursor) {
					recall = true;
				}
				break;

			case EVT_MOVE:
				mark = m->cursor;
				break;

			default:
				break;
		}

		if (recall) {
			assert(mark >= 0 && mark < count);
			shape_lore(sarray[mark]);
		}
	}

	screen_load();

	mem_free(narray);
	mem_free(sarray);
	menu_free(m);
}